

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

OnCallSpec<test_result_(long_long)> * __thiscall
testing::internal::MockSpec<test_result_(long_long)>::InternalDefaultActionSetAt
          (MockSpec<test_result_(long_long)> *this,char *file,int line,char *obj,char *call)

{
  OnCallSpec<test_result_(long_long)> *pOVar1;
  allocator local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&local_50,"ON_CALL(",&local_d1);
  std::operator+(&local_d0,&local_50,obj);
  std::operator+(&local_b0,&local_d0,", ");
  std::operator+(&local_90,&local_b0,call);
  std::operator+(&local_70,&local_90,") invoked");
  LogWithLocation(kInfo,file,line,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_50);
  pOVar1 = FunctionMockerBase<test_result_(long_long)>::AddNewOnCallSpec
                     (this->function_mocker_,file,line,&this->matchers_);
  return pOVar1;
}

Assistant:

internal::OnCallSpec<F>& InternalDefaultActionSetAt(
      const char* file, int line, const char* obj, const char* call) {
    LogWithLocation(internal::kInfo, file, line,
        string("ON_CALL(") + obj + ", " + call + ") invoked");
    return function_mocker_->AddNewOnCallSpec(file, line, matchers_);
  }